

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall
smf::Binasc::getWord(Binasc *this,string *word,string *input,string *terminators,int index)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  bVar2 = false;
  std::__cxx11::string::resize((ulong)word,'\0');
  lVar5 = std::__cxx11::string::find((char)terminators,0x22);
  iVar4 = (int)input->_M_string_length;
  if (index < iVar4) {
    do {
      bVar3 = bVar2;
      if ((lVar5 != -1) && ((input->_M_dataplus)._M_p[index] == '\"')) {
        index = index + 1;
        bVar3 = true;
        if (bVar2) {
          return index;
        }
      }
      bVar2 = bVar3;
      if ((((lVar5 == -1) || (iVar4 + -1 <= index)) ||
          (pcVar1 = (input->_M_dataplus)._M_p, pcVar1[index] != '\\')) ||
         (iVar4 = 2, pcVar1[(long)index + 1] != '\"')) {
        lVar6 = std::__cxx11::string::find
                          ((char)terminators,(ulong)(uint)(int)(input->_M_dataplus)._M_p[index]);
        if (lVar6 != -1) {
          return index + 1;
        }
        iVar4 = 1;
      }
      std::__cxx11::string::push_back((char)word);
      index = index + iVar4;
      iVar4 = (int)input->_M_string_length;
    } while (index < iVar4);
  }
  return index;
}

Assistant:

int Binasc::getWord(std::string& word, const std::string& input,
		const std::string& terminators, int index) {
	word.resize(0);
	int i = index;
	int escape = 0;
	int ecount = 0;
	if (terminators.find('"') != std::string::npos) {
		escape = 1;
	}
	while (i < (int)input.size()) {
		if (escape && input[i] == '\"') {
			ecount++;
			i++;
			if (ecount >= 2) {
				break;
			}
		}
		if (escape && (i<(int)input.size()-1) && (input[i] == '\\')
				&& (input[i+1] == '"')) {
			word.push_back(input[i+1]);
			i += 2;
		} else if (terminators.find(input[i]) == std::string::npos) {
			word.push_back(input[i]);
			i++;
		} else {
			i++;
			return i;
		}
	}
	return i;
}